

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_AStateProvider_A_GunFlash
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  player_t *player;
  bool bVar2;
  undefined8 in_RAX;
  PClassActor *pPVar3;
  FState *state;
  char *pcVar4;
  AWeapon *this;
  DObject *this_00;
  DObject *this_01;
  undefined8 local_38;
  
  if (numparam < 1) {
LAB_0043d764:
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this_01 = (DObject *)(param->field_0).field_1.a;
      local_38 = in_RAX;
      if ((param->field_0).field_1.atag == 1) {
        if (this_01 == (DObject *)0x0) goto LAB_0043d5e6;
        bVar2 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043d774;
        }
      }
      else {
        if (this_01 != (DObject *)0x0) goto LAB_0043d75b;
LAB_0043d5e6:
        this_01 = (DObject *)0x0;
      }
      if (numparam == 1) goto LAB_0043d764;
      if (param[1].field_0.field_3.Type == '\x03') {
        this_00 = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this_00 == (DObject *)0x0) {
LAB_0043d638:
            this_00 = (DObject *)0x0;
          }
          else {
            bVar2 = DObject::IsKindOf(this_00,AStateProvider::RegistrationInfo.MyClass);
            if (!bVar2) {
              pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_0043d774;
            }
          }
          if ((uint)numparam < 3) goto LAB_0043d764;
          if (param[2].field_0.field_3.Type != '\x03') {
            pcVar4 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_0043d774;
          }
          if (numparam == 3) {
            if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
              pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043d7bb:
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x561,
                            "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar1 = defaultparam->Array[3].field_0.i;
            pPVar3 = (PClassActor *)DObject::GetClass(this_00);
            state = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar3,false);
LAB_0043d6ca:
            param = defaultparam->Array;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043d793:
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x562,
                            "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar4 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_0043d7bb;
            }
            iVar1 = param[3].field_0.i;
            pPVar3 = (PClassActor *)DObject::GetClass(this_00);
            state = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar3,false);
            if ((uint)numparam < 5) goto LAB_0043d6ca;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar4 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_0043d793;
            }
          }
          player = (player_t *)this_01[0xe]._vptr_DObject;
          if (player == (player_t *)0x0) {
            return 0;
          }
          if ((undefined1  [16])((undefined1  [16])param[4].field_0 & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            APlayerPawn::PlayAttacking2(player->mo);
          }
          if (state == (FState *)0x0) {
            this = player->ReadyWeapon;
            if (this->bAltFire == true) {
              local_38 = CONCAT44(0xa9,local_38._0_4_);
              state = AActor::FindState((AActor *)this,(FName *)((long)&local_38 + 4));
              if (state != (FState *)0x0) goto LAB_0043d738;
              this = player->ReadyWeapon;
            }
            local_38 = CONCAT44(local_38._4_4_,0xa8);
            state = AActor::FindState((AActor *)this,(FName *)&local_38);
          }
LAB_0043d738:
          P_SetPsprite(player,PSP_FLASH,state,false);
          return 0;
        }
        if (this_00 == (DObject *)0x0) goto LAB_0043d638;
      }
    }
LAB_0043d75b:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0043d774:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x560,
                "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_STATE_ACTION_DEF(flash);
	PARAM_INT_DEF(flags);

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}